

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O1

bool __thiscall ON_SubDHeap::IsValid(ON_SubDHeap *this,bool bSilentError,ON_TextLog *text_log)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  
  bVar2 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspv,m_offset_vertex_id);
  if (bVar2) {
    bVar2 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspe,m_offset_edge_id);
    if (bVar2) {
      bVar2 = ON_FixedSizePool::ElementIdIsIncreasing(&this->m_fspf,m_offset_face_id);
      if (bVar2) {
        uVar3 = ON_FixedSizePool::MaximumElementId(&this->m_fspv,m_offset_vertex_id);
        uVar1 = this->m_max_vertex_id;
        if (uVar1 == uVar3) {
          uVar3 = ON_FixedSizePool::MaximumElementId(&this->m_fspe,m_offset_edge_id);
          uVar1 = this->m_max_edge_id;
          if (uVar1 == uVar3) {
            uVar3 = ON_FixedSizePool::MaximumElementId(&this->m_fspf,m_offset_face_id);
            uVar1 = this->m_max_face_id;
            if (uVar1 == uVar3) {
              return true;
            }
            if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
            pcVar4 = "m_max_face_id = %u != %u = m_fspf.MaximumElementId()\n";
          }
          else {
            if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
            pcVar4 = "m_max_edge_id = %u != %u = m_fspe.MaximumElementId()\n";
          }
        }
        else {
          if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
          pcVar4 = "m_max_vertex_id = %u != %u = m_fspv.MaximumElementId()\n";
        }
        ON_TextLog::Print(text_log,pcVar4,(ulong)uVar1,(ulong)uVar3);
        goto LAB_0061fa7d;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
      pcVar4 = "m_fspf.ElementIdIsIncreasing() is false.";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
      pcVar4 = "m_fspe.ElementIdIsIncreasing() is false.";
    }
  }
  else {
    if (text_log == (ON_TextLog *)0x0) goto LAB_0061fa7d;
    pcVar4 = "m_fspv.ElementIdIsIncreasing() is false.";
  }
  ON_TextLog::Print(text_log,pcVar4);
LAB_0061fa7d:
  ON_SubDIncrementErrorCount();
  if (bSilentError) {
    return false;
  }
  bVar2 = ON_IsNotValid();
  return bVar2;
}

Assistant:

bool ON_SubDHeap::IsValid(
  bool bSilentError,
  ON_TextLog* text_log
) const
{
  if (false == m_fspv.ElementIdIsIncreasing(ON_SubDHeap::m_offset_vertex_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspv.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  if (false == m_fspe.ElementIdIsIncreasing(ON_SubDHeap::m_offset_edge_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspe.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  if (false == m_fspf.ElementIdIsIncreasing(ON_SubDHeap::m_offset_face_id))
  {
    if (nullptr != text_log)
      text_log->Print("m_fspf.ElementIdIsIncreasing() is false.");
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspv_max_id = m_fspv.MaximumElementId(ON_SubDHeap::m_offset_vertex_id);
  if (m_max_vertex_id != max_fspv_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_vertex_id = %u != %u = m_fspv.MaximumElementId()\n", m_max_vertex_id, max_fspv_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspe_max_id = m_fspe.MaximumElementId(ON_SubDHeap::m_offset_edge_id);
  if (m_max_edge_id != max_fspe_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_edge_id = %u != %u = m_fspe.MaximumElementId()\n", m_max_edge_id, max_fspe_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  const unsigned max_fspf_max_id = m_fspf.MaximumElementId(ON_SubDHeap::m_offset_face_id);
  if (m_max_face_id != max_fspf_max_id)
  {
    if (nullptr != text_log)
      text_log->Print("m_max_face_id = %u != %u = m_fspf.MaximumElementId()\n", m_max_face_id, max_fspf_max_id);
    return ON_SubDHeapIsNotValid(bSilentError);
  }

  return true;
}